

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u16 exprCommute(Parse *pParse,Expr *pExpr)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  CollSeq *in_RAX;
  CollSeq *pCVar5;
  undefined1 auVar6 [16];
  
  if ((pExpr->pLeft->op != 0xb1) && (pExpr->pRight->op != 0xb1)) {
    pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pExpr->pLeft,pExpr->pRight);
    in_RAX = sqlite3BinaryCompareCollSeq(pParse,pExpr->pRight,pExpr->pLeft);
    if (pCVar5 == in_RAX) goto LAB_00199521;
  }
  pbVar1 = (byte *)((long)&pExpr->flags + 1);
  *pbVar1 = *pbVar1 ^ 4;
LAB_00199521:
  uVar2 = pExpr->pLeft;
  uVar3 = pExpr->pRight;
  auVar6._8_4_ = (int)uVar2;
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = (int)((ulong)uVar2 >> 0x20);
  pExpr->pLeft = (Expr *)uVar3;
  pExpr->pRight = (Expr *)auVar6._8_8_;
  bVar4 = pExpr->op;
  if (0x36 < bVar4) {
    bVar4 = (bVar4 - 0x37 ^ 2) + 0x37;
    pExpr->op = bVar4;
  }
  return (u16)CONCAT71((int7)((ulong)in_RAX >> 8),bVar4);
}

Assistant:

static u16 exprCommute(Parse *pParse, Expr *pExpr){
  if( pExpr->pLeft->op==TK_VECTOR
   || pExpr->pRight->op==TK_VECTOR
   || sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft, pExpr->pRight) !=
      sqlite3BinaryCompareCollSeq(pParse, pExpr->pRight, pExpr->pLeft)
  ){
    pExpr->flags ^= EP_Commuted;
  }
  SWAP(Expr*,pExpr->pRight,pExpr->pLeft);
  if( pExpr->op>=TK_GT ){
    assert( TK_LT==TK_GT+2 );
    assert( TK_GE==TK_LE+2 );
    assert( TK_GT>TK_EQ );
    assert( TK_GT<TK_LE );
    assert( pExpr->op>=TK_GT && pExpr->op<=TK_GE );
    pExpr->op = ((pExpr->op-TK_GT)^2)+TK_GT;
  }
  return 0;
}